

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

void osgen_gridwin_clear_ptr(char *txtp,osgen_charcolor_t *colorp,size_t len)

{
  size_t sVar1;
  
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    txtp[sVar1] = ' ';
    colorp[sVar1].fg = '\x02';
    colorp[sVar1].bg = '\x01';
  }
  return;
}

Assistant:

static void osgen_gridwin_clear_ptr(char *txtp, osgen_charcolor_t *colorp,
                                    size_t len)
{
    /* loop through the grid from the starting offset */
    for ( ; len != 0 ; --len, ++txtp, ++colorp)
    {
        /* set this character's text to a space */
        *txtp = ' ';

        /* set this character's color to text/transparent */
        colorp->fg = OSGEN_COLOR_TEXT;
        colorp->bg = OSGEN_COLOR_TRANSPARENT;
    }
}